

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kern.cxx
# Opt level: O0

void HAXX::Kern<HAXX::quaternion<double>,HAXX::quaternion<double>,HAXX::quaternion<double>>
               (int32_t M,int32_t N,int32_t K,quaternion<double> *A,quaternion<double> *B,
               quaternion<double> *C,int32_t LDC)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 (*pauVar7) [32];
  undefined1 (*in_RCX) [32];
  int in_EDX;
  int in_ESI;
  int in_EDI;
  undefined8 *in_R8;
  undefined1 (*in_R9) [32];
  int in_stack_00000008;
  __m256d *b10c;
  __m256d *b00c;
  __m256d *b10;
  __m256d *b00;
  __m256d bKKKK;
  __m256d bJJJJ;
  __m256d bIIII;
  __m256d bSSSS;
  __m256d *a10c;
  __m256d *a00c;
  __m256d a_KKKK;
  __m256d a_IIII;
  __m128d b10hi;
  __m128d b10lo;
  __m128d b00hi;
  __m128d b00lo;
  double *BasDouble;
  __m256d a10;
  __m256d a00;
  int32_t k;
  quaternion<double> *locA;
  quaternion<double> *locB;
  __m256d c11;
  __m256d c01;
  __m256d c10;
  __m256d c00;
  bool N2;
  bool M2;
  __m256d t4;
  __m256d t3;
  __m256d t2;
  __m256d t1;
  __m256d *in_stack_fffffffffffff950;
  __m256d *in_stack_fffffffffffff958;
  __m256d *x3;
  __m256d *x2;
  __m256d *x1;
  double dStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  __m256d *y3;
  __m256d *y4;
  __m256d *r1;
  __m256d *r2;
  __m256d *r3;
  double local_620;
  double dStack_618;
  double dStack_610;
  double dStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 *local_590;
  undefined1 *local_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  double local_530;
  double dStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 *local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  int local_494;
  undefined1 (*local_490) [32];
  undefined8 *local_488;
  __m256d local_480;
  undefined1 local_460 [32];
  undefined1 local_440 [16];
  __m256d *padStack_430;
  __m256d *padStack_428;
  undefined1 local_420 [32];
  byte local_3e2;
  byte local_3e1;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 (*local_348) [32];
  undefined1 (*local_320) [32];
  undefined1 (*local_318) [32];
  undefined1 (*local_310) [32];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 (*local_290) [32];
  undefined1 (*local_288) [32];
  double *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  double local_260;
  double dStack_258;
  double dStack_250;
  double dStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  double local_1e0;
  double dStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  double local_1a0;
  double dStack_198;
  double local_190;
  double dStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  
  local_3e1 = in_EDI == 2;
  local_3e2 = in_ESI == 2;
  if ((bool)local_3e1) {
    local_310 = in_R9 + 1;
    y4 = *(__m256d **)*local_310;
    r1 = *(__m256d **)(in_R9[1] + 8);
    r2 = *(__m256d **)(in_R9[1] + 0x10);
    r3 = *(__m256d **)(in_R9[1] + 0x18);
  }
  else {
    local_2c0 = 0;
    uStack_2b8 = 0;
    uStack_2b0 = 0;
    uStack_2a8 = 0;
    y4 = (__m256d *)0x0;
    r1 = (__m256d *)0x0;
    r2 = (__m256d *)0x0;
    r3 = (__m256d *)0x0;
  }
  local_440._8_8_ = r1;
  local_440._0_8_ = y4;
  padStack_430 = r2;
  padStack_428 = r3;
  if ((bool)local_3e2) {
    local_318 = in_R9 + in_stack_00000008;
    local_680 = *(undefined8 *)*local_318;
    uStack_678 = *(undefined8 *)(*local_318 + 8);
    uStack_670 = *(undefined8 *)(*local_318 + 0x10);
    y3 = *(__m256d **)(*local_318 + 0x18);
  }
  else {
    local_2e0 = 0;
    uStack_2d8 = 0;
    uStack_2d0 = 0;
    uStack_2c8 = 0;
    local_680 = 0;
    uStack_678 = 0;
    uStack_670 = 0;
    y3 = (__m256d *)0x0;
  }
  local_460._8_8_ = uStack_678;
  local_460._0_8_ = local_680;
  local_460._16_8_ = uStack_670;
  local_460._24_8_ = y3;
  if (((bool)local_3e1) && ((bool)local_3e2)) {
    local_320 = in_R9 + (long)in_stack_00000008 + 1;
    x3 = *(__m256d **)*local_320;
    x2 = *(__m256d **)(in_R9[(long)in_stack_00000008 + 1] + 8);
    x1 = *(__m256d **)(in_R9[(long)in_stack_00000008 + 1] + 0x10);
    dStack_688 = *(double *)(in_R9[(long)in_stack_00000008 + 1] + 0x18);
  }
  else {
    local_300 = 0;
    uStack_2f8 = 0;
    uStack_2f0 = 0;
    uStack_2e8 = 0;
    x3 = (__m256d *)0x0;
    x2 = (__m256d *)0x0;
    x1 = (__m256d *)0x0;
    dStack_688 = 0.0;
  }
  local_480[1] = (double)x2;
  local_480[0] = (double)x3;
  local_480[2] = (double)x1;
  local_480[3] = dStack_688;
  local_380 = vunpcklpd_avx(*in_R9,local_460);
  local_3c0 = vunpckhpd_avx(*in_R9,local_460);
  local_3a0 = vunpcklpd_avx(_local_440,(undefined1  [32])local_480);
  local_3e0 = vunpckhpd_avx(_local_440,(undefined1  [32])local_480);
  local_420 = vperm2f128_avx(local_380,local_3a0,0x20);
  local_460 = vperm2f128_avx(local_3c0,local_3e0,0x20);
  _local_440 = vperm2f128_avx(local_380,local_3a0,0x31);
  local_480 = (__m256d)vperm2f128_avx(local_3c0,local_3e0,0x31);
  local_494 = in_EDX;
  local_490 = in_RCX;
  local_488 = in_R8;
  local_348 = in_R9;
  if (0 < in_EDX) {
    do {
      local_288 = local_490;
      local_4c0 = *(undefined8 *)*local_490;
      uStack_4b0 = *(undefined8 *)(*local_490 + 0x10);
      auVar1 = *local_490;
      local_290 = local_490 + 1;
      local_4e0 = *(undefined8 *)*local_290;
      uStack_4d0 = *(undefined8 *)(local_490[1] + 0x10);
      local_490 = local_490 + 2;
      local_4e8 = local_488;
      local_268 = local_488;
      local_5c0 = *local_488;
      uStack_5b8 = local_488[1];
      local_270 = local_488 + 2;
      local_600 = *local_270;
      uStack_5f8 = local_488[3];
      local_278 = local_488 + 4;
      local_5e0 = *local_278;
      uStack_5d8 = local_488[5];
      local_280 = (double *)(local_488 + 6);
      local_620 = *local_280;
      dStack_618 = (double)local_488[7];
      local_488 = local_488 + 8;
      local_560 = vpermilpd_avx(auVar1,0xf);
      local_580 = vpermilpd_avx(*local_290,0xf);
      local_588 = local_560;
      local_590 = local_580;
      dStack_610 = local_620;
      dStack_608 = dStack_618;
      uStack_5f0 = local_600;
      uStack_5e8 = uStack_5f8;
      uStack_5d0 = local_5e0;
      uStack_5c8 = uStack_5d8;
      uStack_5b0 = local_5c0;
      uStack_5a8 = uStack_5b8;
      local_530 = local_620;
      dStack_528 = dStack_618;
      local_520 = local_5e0;
      uStack_518 = uStack_5d8;
      local_510 = local_600;
      uStack_508 = uStack_5f8;
      local_500 = local_5c0;
      uStack_4f8 = uStack_5b8;
      uStack_4d8 = local_4e0;
      uStack_4c8 = uStack_4d0;
      uStack_4b8 = local_4c0;
      uStack_4a8 = uStack_4b0;
      local_260 = local_620;
      dStack_258 = dStack_618;
      dStack_250 = local_620;
      dStack_248 = dStack_618;
      local_240 = local_600;
      uStack_238 = uStack_5f8;
      uStack_230 = local_600;
      uStack_228 = uStack_5f8;
      local_220 = local_5e0;
      uStack_218 = uStack_5d8;
      uStack_210 = local_5e0;
      uStack_208 = uStack_5d8;
      local_200 = local_5c0;
      uStack_1f8 = uStack_5b8;
      uStack_1f0 = local_5c0;
      uStack_1e8 = uStack_5b8;
      local_1e0 = local_620;
      dStack_1d8 = dStack_618;
      local_1d0 = local_600;
      uStack_1c8 = uStack_5f8;
      local_1c0 = local_5e0;
      uStack_1b8 = uStack_5d8;
      local_1b0 = local_5c0;
      uStack_1a8 = uStack_5b8;
      local_1a0 = local_620;
      dStack_198 = dStack_618;
      local_190 = local_620;
      dStack_188 = dStack_618;
      local_180 = local_600;
      uStack_178 = uStack_5f8;
      local_170 = local_600;
      uStack_168 = uStack_5f8;
      local_160 = local_5e0;
      uStack_158 = uStack_5d8;
      local_150 = local_5e0;
      uStack_148 = uStack_5d8;
      local_140 = local_5c0;
      uStack_138 = uStack_5b8;
      local_130 = local_5c0;
      uStack_128 = uStack_5b8;
      INC_MULD4Q_NN(x1,x2,x3,in_stack_fffffffffffff958,in_stack_fffffffffffff950,&local_480,y3,y4,r1
                    ,r2,r3,(__m256d *)&local_620);
      local_494 = local_494 + -1;
    } while (0 < local_494);
  }
  auVar3 = vunpcklpd_avx(local_420,local_460);
  auVar1 = vunpckhpd_avx(local_420,local_460);
  auVar4 = vunpcklpd_avx(_local_440,(undefined1  [32])local_480);
  auVar2 = vunpckhpd_avx(_local_440,(undefined1  [32])local_480);
  auVar5 = vperm2f128_avx(auVar3,auVar4,0x20);
  auVar6 = vperm2f128_avx(auVar1,auVar2,0x20);
  auVar3 = vperm2f128_avx(auVar3,auVar4,0x31);
  auVar1 = vperm2f128_avx(auVar1,auVar2,0x31);
  local_420._0_8_ = auVar5._0_8_;
  local_420._8_8_ = auVar5._8_8_;
  local_420._16_8_ = auVar5._16_8_;
  local_420._24_8_ = auVar5._24_8_;
  *(undefined8 *)*local_348 = local_420._0_8_;
  *(undefined8 *)(*local_348 + 8) = local_420._8_8_;
  *(undefined8 *)(*local_348 + 0x10) = local_420._16_8_;
  *(undefined8 *)(*local_348 + 0x18) = local_420._24_8_;
  if ((local_3e1 & 1) != 0) {
    local_440._0_8_ = auVar3._0_8_;
    local_440._8_8_ = auVar3._8_8_;
    padStack_430 = auVar3._16_8_;
    padStack_428 = auVar3._24_8_;
    *(undefined8 *)local_348[1] = local_440._0_8_;
    *(undefined8 *)(local_348[1] + 8) = local_440._8_8_;
    *(__m256d **)(local_348[1] + 0x10) = padStack_430;
    *(__m256d **)(local_348[1] + 0x18) = padStack_428;
  }
  if ((local_3e2 & 1) != 0) {
    pauVar7 = local_348 + in_stack_00000008;
    local_460._0_8_ = auVar6._0_8_;
    local_460._8_8_ = auVar6._8_8_;
    local_460._16_8_ = auVar6._16_8_;
    local_460._24_8_ = auVar6._24_8_;
    *(undefined8 *)*pauVar7 = local_460._0_8_;
    *(undefined8 *)(*pauVar7 + 8) = local_460._8_8_;
    *(undefined8 *)(*pauVar7 + 0x10) = local_460._16_8_;
    *(undefined8 *)(*pauVar7 + 0x18) = local_460._24_8_;
  }
  if (((local_3e1 & 1) != 0) && ((local_3e2 & 1) != 0)) {
    local_480[0] = auVar1._0_8_;
    local_480[1] = auVar1._8_8_;
    local_480[2] = auVar1._16_8_;
    local_480[3] = auVar1._24_8_;
    *(double *)local_348[(long)in_stack_00000008 + 1] = local_480[0];
    *(double *)(local_348[(long)in_stack_00000008 + 1] + 8) = local_480[1];
    *(double *)(local_348[(long)in_stack_00000008 + 1] + 0x10) = local_480[2];
    *(double *)(local_348[(long)in_stack_00000008 + 1] + 0x18) = local_480[3];
  }
  return;
}

Assistant:

void Kern(HAXX_INT M, HAXX_INT N, HAXX_INT K, 
  quaternion<double>* __restrict__ A, quaternion<double>* __restrict__ B, 
  quaternion<double>* __restrict__ C, HAXX_INT LDC) {

  __m256d t1,t2,t3,t4;

  const bool M2 = (M == 2);
  const bool N2 = (N == 2);

  // Load C
  __m256d c00 = LOAD_256D_UNALIGNED_AS(double,C      );

  __m256d c10 = M2 ? LOAD_256D_UNALIGNED_AS(double,C+1    ) :
                           _mm256_setzero_pd();

  __m256d c01 = N2 ? LOAD_256D_UNALIGNED_AS(double,C+LDC  ) :
                           _mm256_setzero_pd();

  __m256d c11 = ( M2 and N2 ) ?  LOAD_256D_UNALIGNED_AS(double,C+LDC+1) :
                                 _mm256_setzero_pd();

  _MM_TRANSPOSE_4x4_PD(c00,c01,c10,c11,t1,t2,t3,t4);


  quaternion<double> *locB = B, *locA = A;

  HAXX_INT k = K;

  if( k > 0 )
  do {

    // Load A 
    __m256d a00 = LOAD_256D_ALIGNED_AS(double,locA);
    __m256d a10 = LOAD_256D_ALIGNED_AS(double,locA+1);
    locA += 2;
    

    // Load B

#ifndef _FACTOR_TRANSPOSE_INTO_B_PACK
    __m256d b00 = LOAD_256D_ALIGNED_AS(double,locB);
    __m256d b10 = LOAD_256D_ALIGNED_AS(double,locB+1);
#else
    double *BasDouble = reinterpret_cast<double*>(locB);
    __m128d b00lo = LOAD_128D_ALIGNED(BasDouble);
    __m128d b00hi = LOAD_128D_ALIGNED(BasDouble+2);
    __m128d b10lo = LOAD_128D_ALIGNED(BasDouble+4);
    __m128d b10hi = LOAD_128D_ALIGNED(BasDouble+6);
#endif
    locB += 2;


#ifdef _FACTOR_TRANSPOSE_INTO_A_PACK

    __m256d a_IIII = _mm256_permute_pd(a00,0xF);
    a00            = _mm256_permute_pd(a00,0x0); // SSSS
  
    __m256d a_KKKK = _mm256_permute_pd(a10,0xF);
    a10            = _mm256_permute_pd(a10,0x0); // SSSS

    __m256d &a00c = a_IIII;
    __m256d &a10c = a_KKKK;

#else

    __m256d a00c = a00;
    __m256d a10c = a10;
    _MM_TRANSPOSE_4x4_PD(a00,a00c,a10,a10c,t1,t2,t3,t4);

#endif

#ifdef _FACTOR_TRANSPOSE_INTO_B_PACK

    __m256d bSSSS = SET_256D_FROM_128D(b00lo,b00lo);
    __m256d bIIII = SET_256D_FROM_128D(b10lo,b10lo);
    __m256d bJJJJ = SET_256D_FROM_128D(b00hi,b00hi);
    __m256d bKKKK = SET_256D_FROM_128D(b10hi,b10hi);

    __m256d &b00  = bSSSS;
    __m256d &b10  = bIIII;
    __m256d &b00c = bJJJJ;
    __m256d &b10c = bKKKK;

#else

    __m256d b00c = b00;
    __m256d b10c = b10;
    _MM_TRANSPOSE_4x4_PD(b00,b10,b00c,b10c,t1,t2,t3,t4);

#endif

    INC_MULD4Q_NN(a00,a00c,a10,a10c,b00,b10,b00c,b10c,c00,c01,c10,c11);
  

    k--;
  } while( k > 0 );

  _MM_TRANSPOSE_4x4_PD(c00,c01,c10,c11,t1,t2,t3,t4);

  STORE_256D_UNALIGNED_AS(double,C      ,c00);
  if( M2 ) STORE_256D_UNALIGNED_AS(double,C+1    ,c10);
  if( N2 ) STORE_256D_UNALIGNED_AS(double,C+LDC  ,c01);
  if( M2 and N2 ) STORE_256D_UNALIGNED_AS(double,C+LDC+1,c11);
  

}